

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

void __thiscall QToolBarLayout::~QToolBarLayout(QToolBarLayout *this)

{
  bool bVar1;
  QWidgetAction *pQVar2;
  QWidget *in_RDI;
  QWidgetAction *widgetAction;
  QToolBarItem *item;
  value_type in_stack_ffffffffffffffd0;
  QWidget *widget;
  
  *(undefined ***)in_RDI = &PTR_metaObject_00d1ee88;
  ((QLayoutItem *)&in_RDI->super_QPaintDevice)->_vptr_QLayoutItem =
       (_func_int **)&PTR__QToolBarLayout_00d1ef90;
  widget = in_RDI;
  while (bVar1 = QList<QToolBarItem_*>::isEmpty((QList<QToolBarItem_*> *)0x6fbe45),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffd0 =
         QList<QToolBarItem_*>::takeFirst((QList<QToolBarItem_*> *)in_stack_ffffffffffffffd0);
    pQVar2 = qobject_cast<QWidgetAction*>((QObject *)0x6fbe6e);
    if ((pQVar2 != (QWidgetAction *)0x0) && ((in_stack_ffffffffffffffd0->customWidget & 1U) != 0)) {
      (*(in_stack_ffffffffffffffd0->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
      QWidgetAction::releaseWidget((QWidgetAction *)in_stack_ffffffffffffffd0,widget);
    }
    if (in_stack_ffffffffffffffd0 != (value_type)0x0) {
      (*(in_stack_ffffffffffffffd0->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[1])();
    }
  }
  QList<QLayoutStruct>::~QList((QList<QLayoutStruct> *)0x6fbed8);
  QList<QToolBarItem_*>::~QList((QList<QToolBarItem_*> *)0x6fbee6);
  QLayout::~QLayout((QLayout *)in_RDI);
  return;
}

Assistant:

QToolBarLayout::~QToolBarLayout()
{
    while (!items.isEmpty()) {
        QToolBarItem *item = items.takeFirst();
        if (QWidgetAction *widgetAction = qobject_cast<QWidgetAction*>(item->action)) {
            if (item->customWidget)
                widgetAction->releaseWidget(item->widget());
        }
        delete item;
    }
}